

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

bool __thiscall spvtools::opt::analysis::ScalarConstant::IsZero(ScalarConstant *this)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar4;
  bool bVar5;
  
  iVar3 = (*(this->super_Constant)._vptr_Constant[0x18])();
  piVar1 = *(int **)CONCAT44(extraout_var,iVar3);
  piVar2 = (int *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  if (piVar1 == piVar2) {
    bVar5 = true;
  }
  else {
    do {
      piVar4 = piVar1 + 1;
      bVar5 = *piVar1 == 0;
      if (!bVar5) {
        return bVar5;
      }
      piVar1 = piVar4;
    } while (piVar4 != piVar2);
  }
  return bVar5;
}

Assistant:

bool IsZero() const override {
    bool is_zero = true;
    for (uint32_t v : words()) {
      if (v != 0) {
        is_zero = false;
        break;
      }
    }
    return is_zero;
  }